

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  BindingHash *bindings;
  ModuleField *pMVar1;
  string_view name_00;
  ModuleField *pMVar2;
  bool bVar3;
  Result RVar4;
  _Head_base<0UL,_wabt::Import_*,_false> _Var5;
  _func_int **pp_Var6;
  pointer *__ptr;
  Enum EVar7;
  long lVar8;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  string name;
  TypeVector local_types;
  ModuleFieldList export_fields;
  Location loc;
  _Head_base<0UL,_wabt::Import_*,_false> local_138;
  Enum local_12c;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_128;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  undefined8 uStack_100;
  string local_f8;
  undefined1 local_d8 [32];
  undefined1 *local_b8;
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  ModuleFieldList local_78;
  pointer local_58;
  pointer pbStack_50;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_48;
  undefined8 uStack_40;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_d8,this);
  local_48.offset = local_d8._16_8_;
  uStack_40 = local_d8._24_8_;
  local_58 = (pointer)local_d8._0_8_;
  pbStack_50 = (pointer)local_d8._8_8_;
  RVar4 = Expect(this,Func);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  ParseBindVarOpt(this,&local_f8);
  local_78.size_ = 0;
  local_78.first_ = (ModuleField *)0x0;
  local_78.last_ = (ModuleField *)0x0;
  RVar4 = ParseInlineExports(this,&local_78,First);
  EVar7 = Error;
  pMVar2 = local_78.first_;
  if (RVar4.enum_ == Error) goto joined_r0x00170365;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::FuncImport,std::__cxx11::string&>((wabt *)&local_138,&local_f8);
    _Var5._M_head_impl = local_138._M_head_impl;
    RVar4 = ParseInlineImport(this,local_138._M_head_impl);
    if (((RVar4.enum_ != Error) &&
        (RVar4 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                      &(((Func *)((long)_Var5._M_head_impl + 0x40))->decl).type_var.
                                       loc.filename.size_), RVar4.enum_ != Error)) &&
       (RVar4 = ParseFuncSignature(this,(FuncSignature *)
                                        &(((Func *)((long)_Var5._M_head_impl + 0x40))->decl).sig.
                                         param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (BindingHash *)
                                   &(((Func *)((long)_Var5._M_head_impl + 0x40))->bindings).
                                    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                                    ._M_h._M_before_begin), RVar4.enum_ != Error)) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"type","");
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"param","");
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"result","");
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                 (string *)local_d8,&local_78);
      lVar8 = 0;
      local_12c = (Enum)ErrorIfLpar(this,&local_118,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      do {
        if (local_88 + lVar8 != *(undefined1 **)((long)local_98 + lVar8)) {
          operator_delete(*(undefined1 **)((long)local_98 + lVar8));
        }
        lVar8 = lVar8 + -0x20;
      } while (lVar8 != -0x60);
      if (local_12c != Error) {
        GetToken((Token *)local_d8,this);
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
        uStack_100 = local_d8._24_8_;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
        local_120._M_head_impl = (ImportModuleField *)operator_new(0x48);
        _Var5._M_head_impl = local_138._M_head_impl;
        local_138._M_head_impl = (Import *)0x0;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_001e6888;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename.data_ =
             (char *)local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename.size_ =
             (size_type)
             local_118.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.field_1.field_1.offset =
             (size_t)local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)
         ((long)&((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                 super_ModuleField.loc.field_1 + 8) = uStack_100;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.type_ = Import;
        ((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_001e6a00;
        ((local_120._M_head_impl)->import)._M_t.
        super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
        super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var5._M_head_impl;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_120);
        if (local_120._M_head_impl != (ImportModuleField *)0x0) {
          (*((local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_120._M_head_impl = (ImportModuleField *)0x0;
        if ((FuncModuleField *)local_138._M_head_impl != (FuncModuleField *)0x0) {
          (*(((ModuleFieldMixin<(wabt::ModuleFieldType)0> *)&(local_138._M_head_impl)->_vptr_Import)
            ->super_ModuleField)._vptr_ModuleField[1])();
        }
LAB_00170483:
        anon_unknown_1::AppendInlineExportFields
                  (module,&local_78,
                   (int)((ulong)((long)(module->funcs).
                                       super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar4 = Expect(this,Rpar);
        EVar7 = (Enum)(RVar4.enum_ == Error);
        pMVar2 = local_78.first_;
        goto joined_r0x00170365;
      }
    }
    pMVar2 = local_78.first_;
    if ((FuncModuleField *)local_138._M_head_impl == (FuncModuleField *)0x0)
    goto joined_r0x00170365;
    pp_Var6 = (((ModuleFieldMixin<(wabt::ModuleFieldType)0> *)
               &(local_138._M_head_impl)->_vptr_Import)->super_ModuleField)._vptr_ModuleField;
    _Var5._M_head_impl = local_138._M_head_impl;
  }
  else {
    _Var5._M_head_impl = (Import *)operator_new(0x148);
    name_00.size_ = local_f8._M_string_length;
    name_00.data_ = local_f8._M_dataplus._M_p;
    (((string *)
     &(((FuncModuleField *)_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
      super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p =
         (pointer)0x0;
    ((string *)
    &(((FuncModuleField *)_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
     super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    (((FuncModuleField *)_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
    super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_001e6888;
    *(size_t *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((FuncModuleField *)_Var5._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc)->_M_local_buf +
     0x10) = local_48.offset;
    *(undefined8 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((FuncModuleField *)_Var5._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc)->_M_local_buf +
     0x18) = uStack_40;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(((FuncModuleField *)_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>)
         .super_ModuleField.loc)->_M_allocated_capacity = (size_type)local_58;
    *(pointer *)
     ((long)&(((FuncModuleField *)_Var5._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.loc + 8) =
         pbStack_50;
    *(undefined4 *)
     &(((FuncModuleField *)_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
      super_ModuleField.type_ = 0;
    (((FuncModuleField *)_Var5._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
    super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__FuncModuleField_001e6b90;
    Func::Func(&((FuncModuleField *)_Var5._M_head_impl)->func,name_00);
    RVar4 = ParseTypeUseOpt(this,&(((FuncModuleField *)_Var5._M_head_impl)->func).decl);
    if (RVar4.enum_ != Error) {
      bindings = &(((FuncModuleField *)_Var5._M_head_impl)->func).bindings;
      RVar4 = ParseFuncSignature(this,&(((FuncModuleField *)_Var5._M_head_impl)->func).decl.sig,
                                 bindings);
      if (RVar4.enum_ != Error) {
        local_d8._0_8_ = (pointer)0x0;
        local_d8._8_8_ = (pointer)0x0;
        local_d8._16_8_ = 0;
        RVar4 = ParseBoundValueTypeList
                          (this,Local,(TypeVector *)local_d8,bindings,
                           (Index)((ulong)((long)(((FuncModuleField *)_Var5._M_head_impl)->func).
                                                 decl.sig.param_types.
                                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(((FuncModuleField *)_Var5._M_head_impl)->func).decl
                                                .sig.param_types.
                                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 2));
        if (RVar4.enum_ != Error) {
          LocalTypes::Set(&(((FuncModuleField *)_Var5._M_head_impl)->func).local_types,
                          (TypeVector *)local_d8);
          RVar4 = ParseTerminatingInstrList
                            (this,&(((FuncModuleField *)_Var5._M_head_impl)->func).exprs);
          if (RVar4.enum_ != Error) {
            local_128._M_head_impl = (FuncModuleField *)_Var5._M_head_impl;
            Module::AppendField(module,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                                        *)&local_128);
            if (local_128._M_head_impl != (FuncModuleField *)0x0) {
              (*((local_128._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_128._M_head_impl = (FuncModuleField *)0x0;
            if ((pointer)local_d8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_d8._0_8_);
            }
            goto LAB_00170483;
          }
        }
        if ((pointer)local_d8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
    }
    pp_Var6 = (((FuncModuleField *)_Var5._M_head_impl)->
              super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField._vptr_ModuleField;
  }
  (*pp_Var6[1])(_Var5._M_head_impl);
  pMVar2 = local_78.first_;
joined_r0x00170365:
  while (pMVar2 != (ModuleField *)0x0) {
    pMVar1 = (pMVar2->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar2->_vptr_ModuleField[1])();
    pMVar2 = pMVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  return (Result)EVar7;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<FuncModuleField>(loc, name);
    Func& func = field->func;
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(TokenType::Local, &local_types,
                                         &func.bindings, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}